

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.cc
# Opt level: O0

CharFormat testing::internal::PrintCharsAsStringTo<char>(char *begin,size_t len,ostream *os)

{
  char ch;
  bool bVar1;
  CharFormat CVar2;
  char *pcVar3;
  ostream *poVar4;
  ulong uStack_38;
  char cur;
  size_t index;
  CharFormat print_format;
  bool is_previous_hex;
  char *quote_prefix;
  ostream *os_local;
  size_t len_local;
  char *begin_local;
  
  pcVar3 = GetCharWidthPrefix(*begin);
  poVar4 = std::operator<<(os,pcVar3);
  std::operator<<(poVar4,"\"");
  bVar1 = false;
  index._0_4_ = kAsIs;
  for (uStack_38 = 0; uStack_38 < len; uStack_38 = uStack_38 + 1) {
    ch = begin[uStack_38];
    if ((bVar1) && (bVar1 = IsXDigit(ch), bVar1)) {
      poVar4 = std::operator<<(os,"\" ");
      poVar4 = std::operator<<(poVar4,pcVar3);
      std::operator<<(poVar4,"\"");
    }
    CVar2 = PrintAsStringLiteralTo(ch,os);
    bVar1 = CVar2 == kHexEscape;
    if (bVar1) {
      index._0_4_ = kHexEscape;
    }
  }
  std::operator<<(os,"\"");
  return (CharFormat)index;
}

Assistant:

static CharFormat PrintCharsAsStringTo(
    const CharType* begin, size_t len, ostream* os) {
  const char* const quote_prefix = GetCharWidthPrefix(*begin);
  *os << quote_prefix << "\"";
  bool is_previous_hex = false;
  CharFormat print_format = kAsIs;
  for (size_t index = 0; index < len; ++index) {
    const CharType cur = begin[index];
    if (is_previous_hex && IsXDigit(cur)) {
      // Previous character is of '\x..' form and this character can be
      // interpreted as another hexadecimal digit in its number. Break string to
      // disambiguate.
      *os << "\" " << quote_prefix << "\"";
    }
    is_previous_hex = PrintAsStringLiteralTo(cur, os) == kHexEscape;
    // Remember if any characters required hex escaping.
    if (is_previous_hex) {
      print_format = kHexEscape;
    }
  }
  *os << "\"";
  return print_format;
}